

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O0

void __thiscall OPN2::OPN2(OPN2 *this)

{
  OPN2 *this_local;
  
  std::
  vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ::vector(&this->m_chips);
  std::vector<OpnTimbre,_std::allocator<OpnTimbre>_>::vector(&this->m_insCache);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_regLFOSens);
  this->m_regLFOSetup = '\0';
  BasicBankMap<OPN2::Bank>::BasicBankMap(&this->m_insBanks);
  this->m_numChips = 1;
  this->m_scaleModulators = false;
  this->m_runAtPcmRate = false;
  this->m_softPanning = false;
  this->m_masterVolume = '\x7f';
  this->m_musicMode = MODE_MIDI;
  this->m_volumeScale = VOLUME_Generic;
  this->m_channelAlloc = OPNMIDI_ChanAlloc_AUTO;
  this->m_lfoEnable = false;
  this->m_lfoFrequency = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&this->m_channelCategory);
  this->m_chipFamily = OPNChip_OPN2;
  (this->m_insBankSetup).volumeModel = 0;
  (this->m_insBankSetup).lfoEnable = 0;
  (this->m_insBankSetup).lfoFrequency = 0;
  (this->m_insBankSetup).chipType = 0;
  (this->m_insBankSetup).mt32defaults = false;
  BasicBankMap<OPN2::Bank>::clear(&this->m_insBanks);
  return;
}

Assistant:

OPN2::OPN2() :
    m_regLFOSetup(0),
    m_numChips(1),
    m_scaleModulators(false),
    m_runAtPcmRate(false),
    m_softPanning(false),
    m_masterVolume(MasterVolumeDefault),
    m_musicMode(MODE_MIDI),
    m_volumeScale(VOLUME_Generic),
    m_channelAlloc(OPNMIDI_ChanAlloc_AUTO),
    m_lfoEnable(false),
    m_lfoFrequency(0),
    m_chipFamily(OPNChip_OPN2)
{
    m_insBankSetup.volumeModel = OPN2::VOLUME_Generic;
    m_insBankSetup.lfoEnable = false;
    m_insBankSetup.lfoFrequency = 0;
    m_insBankSetup.chipType = OPNChip_OPN2;
    m_insBankSetup.mt32defaults = false;

    // Initialize blank instruments banks
    m_insBanks.clear();
}